

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Renderer.cpp
# Opt level: O0

void __thiscall Renderer::RenderContext::RenderContext(RenderContext *this,Module *mod)

{
  Module *mod_00;
  int local_28 [4];
  Module *local_18;
  Module *mod_local;
  RenderContext *this_local;
  
  this->mod = mod;
  this->stepping = false;
  this->step = false;
  local_18 = mod;
  mod_local = (Module *)this;
  std::shared_ptr<trackerboy::Song>::shared_ptr(&this->song,(nullptr_t)0x0);
  trackerboy::DefaultApu::DefaultApu(&this->apu);
  trackerboy::Synth::Synth(&this->synth,&(this->apu).super_Apu,0xac44,59.7);
  mod_00 = Module::data(local_18);
  trackerboy::Engine::Engine(&this->engine,(IApuIo *)&this->apu,mod_00);
  trackerboy::InstrumentPreview::InstrumentPreview(&this->ip);
  this->previewState = none;
  this->previewChannel = ch1;
  trackerboy::Frame::Frame(&this->currentEngineFrame);
  this->state = stopped;
  this->stopCounter = 0;
  this->bufferSize = 0;
  std::chrono::
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  ::time_point(&this->watchdog);
  std::chrono::
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  ::time_point(&this->lastPeriod);
  local_28[0] = 0;
  std::chrono::duration<long,std::ratio<1l,1000000000l>>::duration<int,void>
            ((duration<long,std::ratio<1l,1000000000l>> *)&this->periodTime,local_28);
  this->writesSinceLastPeriod = 0;
  return;
}

Assistant:

Renderer::RenderContext::RenderContext(Module &mod) :
    mod(mod),
    stepping(false),
    step(false),
    song(nullptr),
    apu(),
    synth(apu, 44100),
    engine(apu, &mod.data()),
    ip(),
    previewState(PreviewState::none),
    previewChannel(trackerboy::ChType::ch1),
    state(State::stopped),
    stopCounter(0),
    bufferSize(0),
    watchdog(),
    lastPeriod(),
    periodTime(0),
    writesSinceLastPeriod(0)
{
}